

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

uint64_t __thiscall
nivalis::Environment::addr_of(Environment *this,string *var_name,bool mode_explicit)

{
  pointer puVar1;
  iterator __position;
  pointer pdVar2;
  ulong uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  long *local_48 [2];
  long local_38 [2];
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  if (*(var_name->_M_dataplus)._M_p == '@') {
    std::__cxx11::string::substr((ulong)local_48,(ulong)var_name);
    uVar3 = atoll((char *)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    uVar6 = 0xffffffffffffffff;
    if ((-1 < (long)uVar3) &&
       (uVar6 = 0xffffffffffffffff,
       uVar3 < (ulong)((long)(this->vars).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3))) {
      uVar6 = uVar3;
    }
  }
  else {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&(this->vreg)._M_t,var_name);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->vreg)._M_t._M_impl.super__Rb_tree_header) {
      uVar6 = 0xffffffffffffffff;
      if (!mode_explicit) {
        puVar1 = (this->free_addrs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((this->free_addrs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == puVar1) {
          __position._M_current =
               (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pdVar2 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_48[0] = (long *)0x7ff8000000000000;
          if (__position._M_current ==
              (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&this->vars,__position,(double *)local_48);
          }
          else {
            *__position._M_current = NAN;
            (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar6 = (long)__position._M_current - (long)pdVar2 >> 3;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&this->varname);
        }
        else {
          uVar6 = puVar1[-1];
          (this->free_addrs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1 + -1;
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((this->varname).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6));
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](&this->vreg,var_name);
        *pmVar5 = uVar6;
      }
    }
    else {
      uVar6 = *(ulong *)(iVar4._M_node + 2);
    }
  }
  return uVar6;
}

Assistant:

uint64_t Environment::addr_of(const std::string& var_name, bool mode_explicit) {
    error_msg.clear();
    if (var_name[0] == '@') {
        // Address
        int64_t addr = std::atoll(var_name.substr(1).c_str());
        return (addr < 0 ||
                static_cast<size_t>(addr) >= vars.size()) ?
            -1 : static_cast<uint64_t>(addr);
    }
    auto it = vreg.find(var_name);
    if (it != vreg.end()) {
        return it->second;
    } else {
        if (mode_explicit) return -1;
        uint64_t addr;
        if (free_addrs.empty()) {
            addr = vars.size();
            vars.push_back(std::numeric_limits<double>::quiet_NaN());
            varname.emplace_back();
        } else {
            addr = free_addrs.back();
            free_addrs.pop_back();
        }
        varname[addr] = var_name;
        return vreg[var_name] = addr;
    }
}